

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O1

void __thiscall DatabaseSnapshot::compact_locked_datasets(DatabaseSnapshot *this,Task *task)

{
  string *psVar1;
  runtime_error *this_00;
  string *name;
  string *psVar2;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> datasets;
  OnDiskDataset *ds;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_58;
  OnDiskDataset *local_38;
  
  local_58.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (OnDiskDataset **)0x0;
  local_58.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (OnDiskDataset **)0x0;
  psVar2 = (string *)
           (task->spec_->locks_).
           super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (string *)
           (task->spec_->locks_).
           super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      if ((psVar2 == (string *)0x0) ||
         (name = psVar2, *(__index_type *)&psVar2[1]._M_dataplus._M_p != '\0')) {
        name = (string *)0x0;
      }
      if (name != (string *)0x0) {
        local_38 = find_dataset(this,name);
        if (local_38 == (OnDiskDataset *)0x0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Locked DS doesn\'t exist");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (local_58.
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_58.
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
          _M_realloc_insert<OnDiskDataset_const*const&>
                    ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_38);
        }
        else {
          *local_58.
           super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
           .super__Vector_impl_data._M_finish = local_38;
          local_58.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      psVar2 = (string *)&psVar2[1]._M_string_length;
    } while (psVar2 != psVar1);
  }
  internal_compact(this,task,&local_58);
  if (local_58.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DatabaseSnapshot::compact_locked_datasets(Task *task) const {
    std::vector<const OnDiskDataset *> datasets;
    for (const auto &lock : task->spec().locks()) {
        if (const auto *dslock = std::get_if<DatasetLock>(&lock)) {
            const OnDiskDataset *ds = find_dataset(dslock->target());
            if (ds == nullptr) {
                throw std::runtime_error("Locked DS doesn't exist");
            }
            datasets.push_back(ds);
        }
    }
    internal_compact(task, std::move(datasets));
}